

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sclLiberty.c
# Opt level: O0

void Vec_StrPutI_(Vec_Str_t *vOut,int Val)

{
  int Val_local;
  Vec_Str_t *vOut_local;
  
  Vec_StrPutI(vOut,Val);
  return;
}

Assistant:

static inline void Vec_StrPutI_( Vec_Str_t * vOut, int Val )     { Vec_StrPutI( vOut, Val );  }